

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void __thiscall
host_array_subscript_Test::~host_array_subscript_Test(host_array_subscript_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, front)
{
   camp::array<int, 2> a = {1, 8};

   bool passed = a.front() == 1 &&
                 a[0] == 1 &&
                 a[1] == 8;

   a.front() = 3;

   return passed &&
          a.front() == 3 &&
          a[0] == 3 &&
          a[1] == 8;
}